

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.tweetnacl.c
# Opt level: O2

void car25519(int64_t *o)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  lVar2 = 0;
  while (lVar2 != 0x10) {
    uVar3 = o[lVar2] + 0x10000;
    o[lVar2] = uVar3;
    lVar4 = ((long)uVar3 >> 0x10) + -1;
    lVar5 = lVar2 + 1;
    lVar1 = 0;
    if (lVar2 == 0xf) {
      lVar5 = 0;
      lVar1 = lVar4 * 0x25;
    }
    o[lVar5] = lVar4 + o[lVar5] + lVar1;
    o[lVar2] = o[lVar2] - (uVar3 & 0xffffffffffff0000);
    lVar2 = lVar2 + 1;
  }
  return;
}

Assistant:

static void car25519(gf o)
{
  int64_t c;
  size_t i;

  for (i = 0; i < 16; i++)
  {
    o[i] += (1LL << 16);
    c = o[i] >> 16;
    o[(i + 1) * (i < 15)] += c - 1 + 37 * (c - 1) * (i == 15);
    o[i] -= (int64_t)((uint64_t)c << 16);
  }
}